

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BuffLength::Run(BuffLength *this)

{
  GLuint GVar1;
  char *src_vs;
  char *src_fs;
  GLenum local_c8 [2];
  GLenum props [13];
  int local_88 [2];
  GLint params [3];
  GLchar buff [3];
  GLsizei length;
  GLuint index;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  BuffLength *pBStack_10;
  GLuint program;
  BuffLength *this_local;
  
  pBStack_10 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  local_14 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar1,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  _length = 0;
  GVar1 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,local_14,0x92e1,"someLongName");
  params[1]._1_2_ = 0x6261;
  params[1]._3_1_ = 'c';
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,0,(GLsizei *)0x0,(GLchar *)0x0);
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,0,(GLsizei *)0x0,
             (GLchar *)((long)params + 5));
  if (((params[1]._1_1_ != 'a') || (params[1]._2_1_ != 'b')) || (params[1]._3_1_ != 'c')) {
    anon_unknown_0::Output("ERROR: buff has changed\n");
    _length = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,2,params + 2,(GLchar *)((long)params + 5));
  if (((params[1]._1_1_ != 's') || (params[1]._2_1_ != '\0')) || (params[1]._3_1_ != 'c')) {
    anon_unknown_0::Output("ERROR: buff different then expected\n");
    _length = -1;
  }
  if (params[2] != 1) {
    anon_unknown_0::Output("ERROR: incorrect length, expected 1, got %d\n",(ulong)(uint)params[2]);
    _length = -1;
  }
  local_88[0] = 1;
  local_88[1] = 2;
  params[0] = 3;
  memcpy(local_c8,&DAT_02aafca0,0x34);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,0xd,local_c8,0,(GLsizei *)0x0,(GLint *)0x0)
  ;
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,0xd,local_c8,0,(GLsizei *)0x0,local_88);
  if (((local_88[0] != 1) || (local_88[1] != 2)) || (params[0] != 3)) {
    anon_unknown_0::Output("ERROR: params has changed\n");
    _length = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14,0x92e1,GVar1,0xd,local_c8,2,params + 2,local_88);
  if (((local_88[0] != 0xd) || (local_88[1] != 0x8b52)) || (params[0] != 3)) {
    anon_unknown_0::Output("ERROR: params has incorrect values\n");
    _length = -1;
  }
  if (params[2] != 2) {
    anon_unknown_0::Output("ERROR: incorrect length, expected 2, got %d\n",(ulong)(uint)params[2]);
    _length = -1;
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_14);
  return _length;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		GLuint  index = glGetProgramResourceIndex(program, GL_UNIFORM, "someLongName");
		GLsizei length;
		GLchar  buff[3] = { 'a', 'b', 'c' };
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, NULL);
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, buff);
		if (buff[0] != 'a' || buff[1] != 'b' || buff[2] != 'c')
		{
			Output("ERROR: buff has changed\n");
			error = ERROR;
		}
		glGetProgramResourceName(program, GL_UNIFORM, index, 2, &length, buff);
		if (buff[0] != 's' || buff[1] != '\0' || buff[2] != 'c')
		{
			Output("ERROR: buff different then expected\n");
			error = ERROR;
		}
		if (length != 1)
		{
			Output("ERROR: incorrect length, expected 1, got %d\n", length);
			error = ERROR;
		}

		GLint  params[3] = { 1, 2, 3 };
		GLenum props[]   = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, NULL);
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, params);
		if (params[0] != 1 || params[1] != 2 || params[2] != 3)
		{
			Output("ERROR: params has changed\n");
			error = ERROR;
		}
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 2, &length, params);
		if (params[0] != 13 || params[1] != 35666 || params[2] != 3)
		{
			Output("ERROR: params has incorrect values\n");
			error = ERROR;
		}
		if (length != 2)
		{
			Output("ERROR: incorrect length, expected 2, got %d\n", length);
			error = ERROR;
		}

		glDeleteProgram(program);
		return error;
	}